

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O0

void __thiscall ByteCodeGenerator::PushScope(ByteCodeGenerator *this,Scope *innerScope)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Scope *innerScope_local;
  ByteCodeGenerator *this_local;
  
  if (innerScope == (Scope *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                       ,0x64b,"(innerScope != nullptr)","innerScope != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  Scope::SetEnclosingScope(innerScope,this->currentScope);
  this->currentScope = innerScope;
  bVar2 = Scope::GetIsDynamic(this->currentScope);
  if (bVar2) {
    this->dynamicScopeCount = this->dynamicScopeCount + 1;
  }
  if ((((this->trackEnvDepth & 1U) != 0) &&
      (bVar2 = Scope::GetMustInstantiate(this->currentScope), bVar2)) &&
     (this->envDepth = this->envDepth + 1, this->envDepth == 0)) {
    Js::Throw::OutOfMemory();
  }
  return;
}

Assistant:

void ByteCodeGenerator::PushScope(Scope *innerScope)
{
    Assert(innerScope != nullptr);

    innerScope->SetEnclosingScope(currentScope);

    currentScope = innerScope;

    if (currentScope->GetIsDynamic())
    {
        this->dynamicScopeCount++;
    }

    if (this->trackEnvDepth && currentScope->GetMustInstantiate())
    {
        this->envDepth++;
        if (this->envDepth == 0)
        {
            Js::Throw::OutOfMemory();
        }
    }
}